

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O2

void GetStatistics(ZopfliLZ77Store *store,SymbolStats *stats)

{
  ushort uVar1;
  int iVar2;
  size_t *psVar3;
  ulong uVar4;
  
  for (uVar4 = 0; uVar4 < store->size; uVar4 = uVar4 + 1) {
    uVar1 = store->dists[uVar4];
    if (uVar1 == 0) {
      psVar3 = stats->litlens + store->litlens[uVar4];
    }
    else {
      stats->litlens[*(int *)(ZopfliGetLengthSymbol_table + (ulong)store->litlens[uVar4] * 4)] =
           stats->litlens[*(int *)(ZopfliGetLengthSymbol_table + (ulong)store->litlens[uVar4] * 4)]
           + 1;
      iVar2 = ZopfliGetDistSymbol((uint)uVar1);
      psVar3 = stats->dists + iVar2;
    }
    *psVar3 = *psVar3 + 1;
  }
  stats->litlens[0x100] = 1;
  CalculateStatistics(stats);
  return;
}

Assistant:

static void GetStatistics(const ZopfliLZ77Store* store, SymbolStats* stats) {
  size_t i;
  for (i = 0; i < store->size; i++) {
    if (store->dists[i] == 0) {
      stats->litlens[store->litlens[i]]++;
    } else {
      stats->litlens[ZopfliGetLengthSymbol(store->litlens[i])]++;
      stats->dists[ZopfliGetDistSymbol(store->dists[i])]++;
    }
  }
  stats->litlens[256] = 1;  /* End symbol. */

  CalculateStatistics(stats);
}